

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::QuadricIntersection> * __thiscall
pbrt::Cylinder::BasicIntersect
          (optional<pbrt::QuadricIntersection> *__return_storage_ptr__,Cylinder *this,Ray *r,
          Float tMax)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Interval a;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Interval i;
  float fVar7;
  float fVar8;
  Interval c_00;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  Interval IVar15;
  Interval IVar16;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar24 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  Point3fi oi;
  Vector3fi di;
  Interval b;
  Interval f;
  Interval c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Point3fi local_b8;
  Point3fi local_98;
  Interval local_78;
  Vector3fi local_70;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Interval local_30;
  Interval local_28;
  Interval local_20;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar23._4_4_ = fVar8;
  auVar23._0_4_ = fVar8;
  auVar23._8_4_ = fVar8;
  auVar23._12_4_ = fVar8;
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar9._4_4_ = fVar8;
  auVar9._0_4_ = fVar8;
  auVar9._8_4_ = fVar8;
  auVar9._12_4_ = fVar8;
  local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar23,auVar9);
  fVar8 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar43._4_4_ = fVar8;
  auVar43._0_4_ = fVar8;
  auVar43._8_4_ = fVar8;
  auVar43._12_4_ = fVar8;
  local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar43);
  Transform::operator()(&local_b8,this->objectFromRender,&local_98);
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar10._4_4_ = fVar8;
  auVar10._0_4_ = fVar8;
  auVar10._8_4_ = fVar8;
  auVar10._12_4_ = fVar8;
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar44._4_4_ = fVar8;
  auVar44._0_4_ = fVar8;
  auVar44._8_4_ = fVar8;
  auVar44._12_4_ = fVar8;
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>._0_16_ =
       vmovlhps_avx(auVar10,auVar44);
  fVar8 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar45._4_4_ = fVar8;
  auVar45._0_4_ = fVar8;
  auVar45._8_4_ = fVar8;
  auVar45._12_4_ = fVar8;
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.z =
       (Interval)vmovlps_avx(auVar45);
  Transform::operator()((Vector3fi *)&local_98,this->objectFromRender,&local_70);
  auVar10 = (undefined1  [16])
            local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_;
  auVar69._8_8_ = 0;
  auVar69._0_4_ =
       local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar69._4_4_ =
       local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar69,auVar22);
  auVar23 = vshufps_avx(auVar9,auVar9,0xf5);
  auVar22 = vmaxss_avx(auVar9,auVar23);
  fVar8 = auVar22._0_4_;
  if ((0.0 < auVar10._8_4_) || (auVar22 = vmovshdup_avx(auVar69), auVar22._0_4_ < 0.0)) {
    auVar22 = vminss_avx(auVar23,auVar9);
    fVar7 = auVar22._0_4_ * auVar22._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0),0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar22 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar23 = vminss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vinsertps_avx(auVar23,auVar22,0x10);
    IVar15 = auVar22._0_8_;
  }
  else {
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar46._4_4_ = fVar8;
    auVar46._0_4_ = fVar8;
    auVar46._8_4_ = fVar8;
    auVar46._12_4_ = fVar8;
    auVar22 = vpblendd_avx2(auVar46,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar8),auVar22,1);
    IVar15.high = (Float)((uint)((byte)(uVar1 >> 1) & 1) * (int)fVar8);
    IVar15.low = (Float)((uint)((byte)uVar1 & 1) * (int)fVar8);
  }
  IVar16 = local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
  local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_ = auVar10;
  IVar15 = FMA(IVar16,IVar16,IVar15);
  local_d8._8_8_ = extraout_XMM0_Qb;
  local_d8._0_4_ = IVar15.low;
  local_d8._4_4_ = IVar15.high;
  IVar16.high = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
  IVar16.low = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
               low;
  IVar15 = Interval::operator*((Interval *)&local_98,IVar16);
  i.high = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  i.low = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  IVar16 = Interval::operator*(&local_98.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y,i);
  local_f8 = IVar15.low;
  fStack_f4 = IVar15.high;
  fStack_f0 = (float)extraout_XMM0_Qb_00;
  fStack_ec = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  fVar8 = local_f8 + IVar16.low;
  if (-INFINITY < fVar8) {
    auVar54._0_12_ = ZEXT812(0);
    auVar54._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar54,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar17._0_4_ = local_f8 + IVar16.low;
  auVar17._4_4_ = fStack_f4 + IVar16.high;
  auVar17._8_4_ = fStack_f0 + (float)extraout_XMM0_Qb_01;
  auVar17._12_4_ = fStack_ec + (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  auVar22 = vmovshdup_avx(auVar17);
  if (auVar22._0_4_ < INFINITY) {
    uVar2 = vcmpss_avx512f(auVar22,ZEXT816(0) << 0x40,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar22._0_4_);
    auVar22 = ZEXT416((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar23 = vminss_avx(auVar22,ZEXT416((uint)fVar8));
  auVar22 = vmaxss_avx(auVar22,ZEXT416((uint)fVar8));
  auVar22 = vinsertps_avx(auVar23,auVar22,0x10);
  auVar47._8_4_ = 0x40000000;
  auVar47._0_8_ = 0x4000000040000000;
  auVar47._12_4_ = 0x40000000;
  IVar15 = (Interval)vmovlps_avx(auVar47);
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x = IVar15;
  auVar27._0_8_ = Interval::operator*((Interval *)&local_70,auVar22._0_8_);
  auVar27._8_56_ = extraout_var_05;
  local_78 = (Interval)vmovlps_avx(auVar27._0_16_);
  a.high = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  a.low = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar71._4_4_ =
       local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  auVar71._0_4_ =
       local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar71._8_8_ = 0;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx512vl(auVar71,auVar4);
  auVar23 = vshufps_avx(auVar10,auVar10,0xf5);
  auVar22 = vmaxss_avx(auVar10,auVar23);
  fVar8 = auVar22._0_4_;
  if ((0.0 < local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low)
     || (auVar22 = vmovshdup_avx(auVar71), auVar22._0_4_ < 0.0)) {
    auVar22 = vminss_avx(auVar23,auVar10);
    fVar7 = auVar22._0_4_ * auVar22._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0),0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar22 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar23 = vminss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vinsertps_avx(auVar23,auVar22,0x10);
    c_00 = auVar22._0_8_;
  }
  else {
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar48._4_4_ = fVar8;
    auVar48._0_4_ = fVar8;
    auVar48._8_4_ = fVar8;
    auVar48._12_4_ = fVar8;
    auVar22 = vpblendd_avx2(auVar48,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar8),auVar22,1);
    c_00.high = (Float)((uint)((byte)(uVar1 >> 1) & 1) * (int)fVar8);
    c_00.low = (Float)((uint)((byte)uVar1 & 1) * (int)fVar8);
  }
  auVar22 = vmaxss_avx(local_d8,ZEXT416(0));
  auVar9 = vmovshdup_avx(local_d8);
  auVar28._0_8_ = FMA(a,a,c_00);
  auVar28._8_56_ = extraout_var_06;
  auVar45 = ZEXT816(0) << 0x40;
  auVar23 = vmaxss_avx(auVar28._0_16_,auVar45);
  auVar43 = vmovshdup_avx(auVar28._0_16_);
  auVar10 = vminss_avx(auVar43,auVar23);
  fVar8 = this->radius;
  fVar7 = fVar8 * fVar8;
  auVar44 = ZEXT416((uint)fVar7);
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    uVar2 = vcmpss_avx512f(auVar44,auVar45,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    if (fVar7 < INFINITY) {
      uVar2 = vcmpss_avx512f(auVar44,ZEXT816(0),0);
      fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
      auVar44 = ZEXT416((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
    }
    auVar69 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    auVar45 = vminss_avx(auVar44,auVar69);
    auVar44 = vmaxss_avx(auVar44,auVar69);
    auVar11 = vinsertps_avx(auVar45,auVar44,0x10);
  }
  else {
    if (fVar7 < INFINITY) {
      uVar2 = vcmpss_avx512f(auVar44,auVar45,0);
      fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7 + 1);
    }
    auVar65._4_4_ = fVar7;
    auVar65._0_4_ = fVar7;
    auVar65._8_4_ = fVar7;
    auVar65._12_4_ = fVar7;
    auVar44 = vpblendd_avx2(auVar65,ZEXT416(0) << 0x40,0xd);
    uVar1 = vcmpps_avx512vl(ZEXT416((uint)fVar7),auVar44,1);
    auVar11._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar7;
    auVar11._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar7;
    auVar11._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar7;
    auVar11._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar7;
  }
  auVar44 = vminss_avx(auVar9,ZEXT416(auVar22._0_4_));
  auVar22 = vmaxss_avx(auVar9,ZEXT416(auVar22._0_4_));
  auVar23 = vmaxss_avx(auVar43,auVar23);
  auVar9 = vmovshdup_avx(auVar11);
  fVar8 = auVar10._0_4_ - auVar9._0_4_;
  if (-INFINITY < fVar8) {
    auVar55._0_12_ = ZEXT812(0);
    auVar55._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar55,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar22 = vinsertps_avx(auVar44,auVar22,0x10);
  fVar7 = auVar23._0_4_ - auVar11._0_4_;
  if (fVar7 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x20,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
    fVar7 = (float)((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar10 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar23 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar23 = vinsertps_avx(auVar10,auVar23,0x10);
  local_20 = (Interval)vmovlps_avx(auVar23);
  auVar18._8_4_ = 0x40000000;
  auVar18._0_8_ = 0x4000000040000000;
  auVar18._12_4_ = 0x40000000;
  uVar2 = vmovlps_avx(auVar18);
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
       (Float)(int)uVar2;
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
       (Float)(int)((ulong)uVar2 >> 0x20);
  local_d8._0_8_ = auVar22._0_8_;
  IVar15 = Interval::operator*((Interval *)&local_70,(Interval)local_d8._0_8_);
  auVar29._0_8_ = Interval::operator/(&local_78,IVar15);
  auVar29._8_56_ = extraout_var_07;
  local_28 = (Interval)vmovlps_avx(auVar29._0_16_);
  auVar30._0_8_ =
       Interval::operator*(&local_28,
                           local_98.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.x);
  auVar30._8_56_ = extraout_var_08;
  auVar22 = vmovshdup_avx(auVar30._0_16_);
  fVar8 = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low -
          auVar22._0_4_;
  if (-INFINITY < fVar8) {
    auVar49._0_12_ = ZEXT812(0);
    auVar49._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar49,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  fVar7 = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high -
          auVar30._0_4_;
  local_c8 = ZEXT416((uint)fVar7);
  if (fVar7 < INFINITY) {
    uVar2 = vcmpss_avx512f(local_c8,ZEXT816(0) << 0x40,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
    local_c8 = ZEXT416((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar31._0_8_ =
       Interval::operator*(&local_28,
                           local_98.super_Point3<pbrt::Interval>.
                           super_Tuple3<pbrt::Point3,_pbrt::Interval>.y);
  auVar31._8_56_ = extraout_var_09;
  auVar22 = vmovshdup_avx(auVar31._0_16_);
  fVar7 = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low -
          auVar22._0_4_;
  if (-INFINITY < fVar7) {
    auVar56._0_12_ = ZEXT812(0);
    auVar56._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),auVar56,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    fVar7 = (float)((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
  }
  auVar23 = vminss_avx(local_c8,ZEXT416((uint)fVar8));
  auVar22 = vmaxss_avx(local_c8,ZEXT416((uint)fVar8));
  fVar8 = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high -
          auVar31._0_4_;
  if (fVar8 < INFINITY) {
    auVar57._0_12_ = ZEXT812(0);
    auVar57._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar57,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
    fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  auVar45 = vminss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar7));
  auVar43 = vmaxss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar7));
  auVar66._8_4_ = 0x7fffffff;
  auVar66._0_8_ = 0x7fffffff7fffffff;
  auVar66._12_4_ = 0x7fffffff;
  auVar10 = vandps_avx(auVar23,auVar66);
  auVar9 = vandps_avx(auVar22,auVar66);
  auVar44 = vmaxss_avx(auVar10,auVar9);
  fVar8 = auVar44._0_4_;
  if ((0.0 < auVar23._0_4_) || (auVar22._0_4_ < 0.0)) {
    auVar22 = vminss_avx(auVar9,auVar10);
    fVar7 = auVar22._0_4_ * auVar22._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar22 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar23 = vminss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar12 = vinsertps_avx(auVar23,auVar22,0x10);
  }
  else {
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar19._4_4_ = fVar8;
    auVar19._0_4_ = fVar8;
    auVar19._8_4_ = fVar8;
    auVar19._12_4_ = fVar8;
    auVar22 = vpblendd_avx2(auVar19,ZEXT816(0) << 0x40,0xd);
    auVar70._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    auVar70._0_4_ = fVar8;
    uVar1 = vcmpps_avx512vl(auVar70,auVar22,1);
    auVar12._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar8;
    auVar12._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar8;
    auVar12._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar8;
    auVar12._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar8;
  }
  auVar22 = vandps_avx(auVar45,auVar66);
  auVar23 = vandps_avx(auVar43,auVar66);
  auVar10 = vmaxss_avx(auVar22,auVar23);
  fVar8 = auVar10._0_4_;
  if ((0.0 < auVar45._0_4_) || (auVar43._0_4_ < 0.0)) {
    auVar22 = vminss_avx(auVar23,auVar22);
    fVar7 = auVar22._0_4_ * auVar22._0_4_;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar7);
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x20,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar22 = ZEXT416((int)fVar7 + -1 + (uint)(fVar7 <= 0.0) * 2);
    auVar23 = vminss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar8),auVar22);
    auVar13 = vinsertps_avx(auVar23,auVar22,0x10);
  }
  else {
    fVar8 = fVar8 * fVar8;
    if (fVar8 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar8);
      fVar8 = (float)((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar50._4_4_ = fVar8;
    auVar50._0_4_ = fVar8;
    auVar50._8_4_ = fVar8;
    auVar50._12_4_ = fVar8;
    auVar22 = vpblendd_avx2(auVar50,ZEXT816(0) << 0x40,0xd);
    auVar58._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    auVar58._0_4_ = fVar8;
    uVar1 = vcmpps_avx512vl(auVar58,auVar22,1);
    auVar13._4_4_ = (uint)((byte)(uVar1 >> 1) & 1) * (int)fVar8;
    auVar13._0_4_ = (uint)((byte)uVar1 & 1) * (int)fVar8;
    auVar13._8_4_ = (uint)((byte)(uVar1 >> 2) & 1) * (int)fVar8;
    auVar13._12_4_ = (uint)((byte)(uVar1 >> 3) & 1) * (int)fVar8;
  }
  fVar8 = auVar12._0_4_ + auVar13._0_4_;
  if (-INFINITY < fVar8) {
    auVar59._0_12_ = ZEXT812(0);
    auVar59._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar59,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  auVar20._0_4_ = auVar12._0_4_ + auVar13._0_4_;
  auVar20._4_4_ = auVar12._4_4_ + auVar13._4_4_;
  auVar20._8_4_ = auVar12._8_4_ + auVar13._8_4_;
  auVar20._12_4_ = auVar12._12_4_ + auVar13._12_4_;
  auVar22 = vmovshdup_avx(auVar20);
  if (auVar22._0_4_ < INFINITY) {
    uVar2 = vcmpss_avx512f(auVar22,ZEXT416(0) << 0x20,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar22._0_4_);
    auVar22 = ZEXT416((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar23 = vminss_avx(auVar22,ZEXT416((uint)fVar8));
  if (auVar23._0_4_ < 0.0) {
    auVar32._0_4_ = sqrtf(auVar23._0_4_);
    auVar32._4_60_ = extraout_var;
    auVar23 = auVar32._0_16_;
  }
  else {
    auVar23 = vsqrtss_avx(auVar23,auVar23);
  }
  auVar22 = vmaxss_avx(auVar22,ZEXT416((uint)fVar8));
  if (-INFINITY < auVar23._0_4_) {
    auVar51._0_12_ = ZEXT812(0);
    auVar51._12_4_ = 0;
    uVar2 = vcmpss_avx512f(auVar23,auVar51,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar23._0_4_);
    auVar23 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  if (auVar22._0_4_ < 0.0) {
    auVar33._0_4_ = sqrtf(auVar22._0_4_);
    auVar33._4_60_ = extraout_var_00;
    auVar22 = auVar33._0_16_;
  }
  else {
    auVar22 = vsqrtss_avx(auVar22,auVar22);
  }
  if (auVar22._0_4_ < INFINITY) {
    uVar2 = vcmpss_avx512f(auVar22,ZEXT816(0) << 0x40,0);
    fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar22._0_4_);
    auVar22 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
  }
  auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
  auVar10 = vminss_avx(auVar22,auVar23);
  auVar22 = vmaxss_avx(auVar22,auVar23);
  auVar21._8_4_ = 0x40800000;
  auVar21._0_8_ = 0x4080000040800000;
  auVar21._12_4_ = 0x40800000;
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x =
       (Interval)vmovlps_avx(auVar21);
  auVar34._0_8_ = Interval::operator*((Interval *)&local_70,(Interval)local_d8._0_8_);
  auVar34._8_56_ = extraout_var_10;
  local_30 = (Interval)vmovlps_avx(auVar34._0_16_);
  fVar8 = this->radius + auVar10._0_4_;
  if (-INFINITY < fVar8) {
    auVar60._0_12_ = ZEXT812(0);
    auVar60._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar60,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  fVar7 = this->radius + auVar22._0_4_;
  if (fVar7 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
    fVar7 = (float)((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar9 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar23 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar23 = vinsertps_avx(auVar9,auVar23,0x10);
  auVar35._0_8_ = Interval::operator*(&local_30,auVar23._0_8_);
  auVar35._8_56_ = extraout_var_11;
  uVar2 = vmovlps_avx(auVar35._0_16_);
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
       (Float)(int)uVar2;
  local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
       (Float)(int)((ulong)uVar2 >> 0x20);
  fVar8 = this->radius - auVar22._0_4_;
  if (-INFINITY < fVar8) {
    auVar61._0_12_ = ZEXT812(0);
    auVar61._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar61,0);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
    fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
  }
  fVar7 = this->radius - auVar10._0_4_;
  if (fVar7 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
    fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
    fVar7 = (float)((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
  }
  auVar23 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar22 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
  auVar22 = vinsertps_avx(auVar23,auVar22,0x10);
  auVar36._0_8_ = Interval::operator*((Interval *)&local_70,auVar22._0_8_);
  auVar36._8_56_ = extraout_var_12;
  auVar22 = auVar36._0_16_;
  fVar8 = auVar36._0_4_;
  if (0.0 <= fVar8) {
    if (fVar8 < 0.0) {
      auVar37._0_4_ = sqrtf(fVar8);
      auVar37._4_60_ = extraout_var_01;
      auVar23 = auVar37._0_16_;
    }
    else {
      auVar23 = vsqrtss_avx(auVar22,auVar22);
    }
    if (-INFINITY < auVar23._0_4_) {
      auVar24._0_12_ = ZEXT812(0);
      auVar24._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar23,auVar24,0);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)auVar23._0_4_);
      auVar23 = ZEXT416((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
    }
    auVar22 = vmovshdup_avx(auVar22);
    if (auVar22._0_4_ < 0.0) {
      auVar38._0_4_ = sqrtf(auVar22._0_4_);
      auVar38._4_60_ = extraout_var_02;
      auVar22 = auVar38._0_16_;
    }
    else {
      auVar22 = vsqrtss_avx(auVar22,auVar22);
    }
    if (auVar22._0_4_ < INFINITY) {
      uVar2 = vcmpss_avx512f(auVar22,ZEXT816(0) << 0x40,0);
      fVar8 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)auVar22._0_4_);
      auVar22 = ZEXT416((-(uint)(fVar8 < 0.0) | 1) + (int)fVar8);
    }
    auVar23 = vmaxss_avx(auVar23,ZEXT816(0) << 0x40);
    auVar10 = vminss_avx(auVar22,auVar23);
    auVar22 = vmaxss_avx(auVar22,auVar23);
    if (0.0 <= (local_78.low + local_78.high) * 0.5) {
      fVar8 = auVar10._0_4_ + local_78.low;
      if (-INFINITY < fVar8) {
        auVar62._0_12_ = ZEXT812(0);
        auVar62._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar62,0);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
        fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
      }
      fVar7 = auVar22._0_4_ + local_78.high;
    }
    else {
      fVar8 = local_78.low - auVar22._0_4_;
      if (-INFINITY < fVar8) {
        auVar67._0_12_ = ZEXT812(0);
        auVar67._12_4_ = 0;
        uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar8),auVar67,0);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar8 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * (int)fVar8);
        fVar8 = (float)((int)fVar8 + -1 + (uint)(fVar8 <= 0.0) * 2);
      }
      fVar7 = local_78.high - auVar10._0_4_;
    }
    if (fVar7 < INFINITY) {
      uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),ZEXT816(0) << 0x40,0);
      fVar7 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar7);
      fVar7 = (float)((-(uint)(fVar7 < 0.0) | 1) + (int)fVar7);
    }
    auVar23 = vminss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
    auVar22 = vmaxss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar8));
    auVar22 = vinsertps_avx(auVar23,auVar22,0x10);
    auVar52._8_4_ = 0xbf000000;
    auVar52._0_8_ = 0xbf000000bf000000;
    auVar52._12_4_ = 0xbf000000;
    local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x =
         (Interval)vmovlps_avx(auVar52);
    auVar39._0_8_ = Interval::operator*((Interval *)&local_70,auVar22._0_8_);
    auVar39._8_56_ = extraout_var_13;
    uVar2 = vmovlps_avx(auVar39._0_16_);
    local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.low =
         (Float)(int)uVar2;
    local_70.super_Vector3<pbrt::Interval>.super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x.high =
         (Float)(int)((ulong)uVar2 >> 0x20);
    IVar15 = Interval::operator/((Interval *)&local_70,(Interval)local_d8._0_8_);
    local_d8._8_8_ = extraout_XMM0_Qb_02;
    local_d8._0_4_ = IVar15.low;
    local_d8._4_4_ = IVar15.high;
    auVar40._0_8_ =
         Interval::operator/(&local_20,
                             local_70.super_Vector3<pbrt::Interval>.
                             super_Tuple3<pbrt::Vector3,_pbrt::Interval>.x);
    auVar40._8_56_ = extraout_var_14;
    auVar22 = auVar40._0_16_;
    local_48 = local_d8;
    if (IVar15.low <= auVar40._0_4_) {
      local_48 = auVar22;
      auVar22 = local_d8;
    }
    auVar23 = vmovshdup_avx(auVar22);
    fVar8 = auVar23._0_4_;
    if ((tMax < fVar8) || (local_48._0_4_ <= 0.0)) goto LAB_002ef03b;
    if (auVar22._0_4_ <= 0.0) {
      auVar22 = vmovshdup_avx(local_48);
      fVar8 = auVar22._0_4_;
      auVar22 = local_48;
      if (tMax < fVar8) goto LAB_002ef03b;
    }
    auVar5._4_4_ = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.high;
    auVar5._0_4_ = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.low;
    auVar5._8_4_ = local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   y.low;
    auVar5._12_4_ =
         local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    fVar64 = auVar22._0_4_;
    fVar14 = (fVar64 + fVar8) * 0.5;
    fVar7 = (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
            + local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              high) * 0.5 +
            fVar14 * (local_98.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                     local_98.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
    auVar22 = vinsertps_avx(auVar5,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    auVar23 = vinsertps_avx((undefined1  [16])
                            local_98.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                            ZEXT416((uint)local_98.super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
    local_58._0_4_ =
         (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
         auVar22._0_4_) * 0.5 +
         fVar14 * (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   x.high + auVar23._0_4_) * 0.5;
    local_58._4_4_ =
         (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
         auVar22._4_4_) * 0.5 +
         fVar14 * (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                   y.low + auVar23._4_4_) * 0.5;
    local_58._8_4_ = (auVar22._8_4_ + 0.0) * 0.5 + fVar14 * (auVar23._8_4_ + 0.0) * 0.5;
    local_58._12_4_ = (auVar22._12_4_ + 0.0) * 0.5 + fVar14 * (auVar23._12_4_ + 0.0) * 0.5;
    auVar25._0_4_ = local_58._0_4_ * local_58._0_4_;
    auVar25._4_4_ = local_58._4_4_ * local_58._4_4_;
    auVar25._8_4_ = local_58._8_4_ * local_58._8_4_;
    auVar25._12_4_ = local_58._12_4_ * local_58._12_4_;
    auVar22 = vmovshdup_avx(auVar25);
    auVar22 = vfmadd231ss_fma(auVar22,local_58,local_58);
    if (auVar22._0_4_ < 0.0) {
      fVar14 = sqrtf(auVar22._0_4_);
    }
    else {
      auVar22 = vsqrtss_avx(auVar22,auVar22);
      fVar14 = auVar22._0_4_;
    }
    fVar14 = this->radius / fVar14;
    auVar53._0_4_ = local_58._0_4_ * fVar14;
    auVar53._4_4_ = local_58._4_4_ * fVar14;
    auVar53._8_4_ = local_58._8_4_ * fVar14;
    auVar53._12_4_ = local_58._12_4_ * fVar14;
    auVar22 = vmovshdup_avx(auVar53);
    local_58 = auVar53;
    auVar41._0_4_ = atan2f(auVar22._0_4_,auVar53._0_4_);
    auVar41._4_60_ = extraout_var_03;
    if ((this->zMin <= fVar7) && (fVar7 <= this->zMax)) {
      uVar2 = vcmpss_avx512f(auVar41._0_16_,ZEXT416(0),1);
      bVar3 = (bool)((byte)uVar2 & 1);
      fVar14 = (float)((uint)bVar3 * (int)(auVar41._0_4_ + 6.2831855) +
                      (uint)!bVar3 * (int)auVar41._0_4_);
      if (fVar14 <= this->phiMax) goto LAB_002eefdc;
    }
    fVar7 = local_48._0_4_;
    auVar22 = vmovshdup_avx(local_48);
    fVar68 = auVar22._0_4_;
    if ((fVar64 == fVar7) && (!NAN(fVar64) && !NAN(fVar7))) {
      if ((fVar8 == fVar68) && (!NAN(fVar8) && !NAN(fVar68))) goto LAB_002ef03b;
    }
    if (fVar68 <= tMax) {
      auVar6._4_4_ = local_b8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar6._0_4_ = local_b8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar6._8_4_ = local_b8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar6._12_4_ =
           local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar8 = (fVar7 + fVar68) * 0.5;
      fVar7 = (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
               low + local_b8.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 +
              fVar8 * (local_98.super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      local_98.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar22 = vinsertps_avx(auVar6,ZEXT416((uint)local_b8.super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar23 = vinsertps_avx((undefined1  [16])
                              local_98.super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                              ZEXT416((uint)local_98.super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10)
      ;
      auVar63._0_4_ =
           (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
           + auVar22._0_4_) * 0.5 +
           fVar8 * (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                    .x.high + auVar23._0_4_) * 0.5;
      auVar63._4_4_ =
           (local_b8.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
           auVar22._4_4_) * 0.5 +
           fVar8 * (local_98.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                    .y.low + auVar23._4_4_) * 0.5;
      auVar63._8_4_ = (auVar22._8_4_ + 0.0) * 0.5 + fVar8 * (auVar23._8_4_ + 0.0) * 0.5;
      auVar63._12_4_ = (auVar22._12_4_ + 0.0) * 0.5 + fVar8 * (auVar23._12_4_ + 0.0) * 0.5;
      auVar26._0_4_ = auVar63._0_4_ * auVar63._0_4_;
      auVar26._4_4_ = auVar63._4_4_ * auVar63._4_4_;
      auVar26._8_4_ = auVar63._8_4_ * auVar63._8_4_;
      auVar26._12_4_ = auVar63._12_4_ * auVar63._12_4_;
      auVar22 = vmovshdup_avx(auVar26);
      auVar22 = vfmadd231ss_fma(auVar22,auVar63,auVar63);
      if (auVar22._0_4_ < 0.0) {
        fVar8 = sqrtf(auVar22._0_4_);
      }
      else {
        auVar22 = vsqrtss_avx(auVar22,auVar22);
        fVar8 = auVar22._0_4_;
      }
      fVar8 = this->radius / fVar8;
      local_58._0_4_ = auVar63._0_4_ * fVar8;
      local_58._4_4_ = auVar63._4_4_ * fVar8;
      local_58._8_4_ = auVar63._8_4_ * fVar8;
      local_58._12_4_ = auVar63._12_4_ * fVar8;
      auVar22 = vmovshdup_avx(local_58);
      auVar42._0_4_ = atan2f(auVar22._0_4_,local_58._0_4_);
      auVar42._4_60_ = extraout_var_04;
      if ((this->zMin <= fVar7) && (fVar7 <= this->zMax)) {
        uVar2 = vcmpss_avx512f(auVar42._0_16_,ZEXT416(0),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        fVar14 = (float)((uint)bVar3 * (int)(auVar42._0_4_ + 6.2831855) +
                        (uint)!bVar3 * (int)auVar42._0_4_);
        if (fVar14 <= this->phiMax) {
          fVar64 = (float)local_48._0_4_;
          fVar8 = fVar68;
LAB_002eefdc:
          __return_storage_ptr__->set = true;
          *(float *)&__return_storage_ptr__->optionalValue = (fVar64 + fVar8) * 0.5;
          uVar2 = vmovlps_avx(local_58);
          *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 4) = uVar2;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0xc) = fVar7;
          *(float *)((long)&__return_storage_ptr__->optionalValue + 0x10) = fVar14;
          return __return_storage_ptr__;
        }
      }
    }
  }
LAB_002ef03b:
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<QuadricIntersection> BasicIntersect(const Ray &r, Float tMax) const {
        Float phi;
        Point3f pHit;
        // Transform _Ray_ origin and direction to object space
        Point3fi oi = (*objectFromRender)(Point3fi(r.o));
        Vector3fi di = (*objectFromRender)(Vector3fi(r.d));

        // Solve quadratic equation to find cylinder _t0_ and _t1_ values
        Interval t0, t1;
        // Compute cylinder quadratic coefficients
        Interval a = SumSquares(di.x, di.y);
        Interval b = 2 * (di.x * oi.x + di.y * oi.y);
        Interval c = SumSquares(oi.x, oi.y) - Sqr(Interval(radius));

        // Compute cylinder quadratic discriminant _discrim_
        Interval f = b / (2 * a);
        Interval fx = oi.x - f * di.x, fy = oi.y - f * di.y;
        Interval sqrtf = Sqrt(Sqr(fx) + Sqr(fy));
        Interval discrim =
            4 * a * (Interval(radius) + sqrtf) * (Interval(radius) - sqrtf);
        if (discrim.LowerBound() < 0)
            return {};

        // Compute quadratic $t$ values
        Interval rootDiscrim = Sqrt(discrim);
        Interval q;
        if ((Float)b < 0)
            q = -.5f * (b - rootDiscrim);
        else
            q = -.5f * (b + rootDiscrim);
        t0 = q / a;
        t1 = c / q;
        // Swap quadratic $t$ values so that _t0_ is the lesser
        if (t0.LowerBound() > t1.LowerBound())
            pstd::swap(t0, t1);

        // Check quadric shape _t0_ and _t1_ for nearest intersection
        if (t0.UpperBound() > tMax || t1.LowerBound() <= 0)
            return {};
        Interval tShapeHit = t0;
        if (tShapeHit.LowerBound() <= 0) {
            tShapeHit = t1;
            if (tShapeHit.UpperBound() > tMax)
                return {};
        }

        // Compute cylinder hit point and $\phi$
        pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
        // Refine cylinder intersection point
        Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
        pHit.x *= radius / hitRad;
        pHit.y *= radius / hitRad;

        phi = std::atan2(pHit.y, pHit.x);
        if (phi < 0)
            phi += 2 * Pi;

        // Test cylinder intersection against clipping parameters
        if (pHit.z < zMin || pHit.z > zMax || phi > phiMax) {
            if (tShapeHit == t1)
                return {};
            tShapeHit = t1;
            if (t1.UpperBound() > tMax)
                return {};
            // Compute cylinder hit point and $\phi$
            pHit = Point3f(oi) + (Float)tShapeHit * Vector3f(di);
            // Refine cylinder intersection point
            Float hitRad = std::sqrt(pHit.x * pHit.x + pHit.y * pHit.y);
            pHit.x *= radius / hitRad;
            pHit.y *= radius / hitRad;

            phi = std::atan2(pHit.y, pHit.x);
            if (phi < 0)
                phi += 2 * Pi;

            if (pHit.z < zMin || pHit.z > zMax || phi > phiMax)
                return {};
        }

        // Return _QuadricIntersection_ for cylinder intersection
        return QuadricIntersection{(Float)tShapeHit, pHit, phi};
    }